

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

bool __thiscall testing::TestResult::Skipped(TestResult *this)

{
  pointer pTVar1;
  bool bVar2;
  uint uVar3;
  pointer pTVar4;
  
  bVar2 = Failed(this);
  if (bVar2) {
    uVar3 = 0;
  }
  else {
    pTVar4 = (this->test_part_results_).
             super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pTVar1 = (this->test_part_results_).
             super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    uVar3 = 0;
    if (pTVar4 != pTVar1) {
      do {
        uVar3 = uVar3 + (pTVar4->type_ == kSkip);
        pTVar4 = pTVar4 + 1;
      } while (pTVar4 != pTVar1);
      uVar3 = (uint)(uVar3 != 0);
    }
  }
  return SUB41(uVar3,0);
}

Assistant:

bool TestResult::Skipped() const {
  return !Failed() && CountIf(test_part_results_, TestPartSkipped) > 0;
}